

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::PartitioningColumnValue::~PartitioningColumnValue(PartitioningColumnValue *this)

{
  ::std::__cxx11::string::~string((string *)&this->value);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit PartitioningColumnValue(string value_p) : value(std::move(value_p)) {
	}